

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::a64::Assembler::align(Assembler *this,AlignMode alignMode,uint32_t alignment)

{
  Logger *pLVar1;
  Error EVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  undefined1 *puVar6;
  ulong uVar7;
  Error EStack_f0;
  CodeWriter writer;
  FormatIndentationGroup local_dc;
  undefined8 local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [136];
  
  if ((this->super_BaseAssembler).super_BaseEmitter._code == (CodeHolder *)0x0) {
    EStack_f0 = 5;
  }
  else {
    if (alignMode < (kMaxValue|kData)) {
      if (alignment < 2) {
        return 0;
      }
      if ((alignment < 0x41) &&
         (uVar4 = alignment - (alignment >> 1 & 0x55555555),
         uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333),
         ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
        writer._cursor = (this->super_BaseAssembler)._bufferPtr;
        lVar5 = (long)writer._cursor - (long)(this->super_BaseAssembler)._bufferData;
        uVar7 = (-(ulong)alignment & (lVar5 + (ulong)alignment) - 1) - lVar5;
        if ((int)uVar7 == 0) {
          return 0;
        }
        EVar2 = CodeWriter::ensureSpace(&writer,&this->super_BaseAssembler,uVar7 & 0xffffffff);
        if (EVar2 != 0) {
          return EVar2;
        }
        if (alignMode == kCode) {
          if ((*(int *)&(this->super_BaseAssembler)._bufferPtr -
               *(int *)&(this->super_BaseAssembler)._bufferData & 3U) != 0) {
            return 3;
          }
          while (uVar4 = (uint)uVar7, 3 < uVar4) {
            writer._cursor[0] = '\x1f';
            writer._cursor[1] = ' ';
            writer._cursor[2] = '\x03';
            writer._cursor[3] = 0xd5;
            writer._cursor = writer._cursor + 4;
            uVar7 = (ulong)(uVar4 - 4);
          }
          if (uVar4 != 0) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/a64assembler.cpp"
                       ,0x1437,"i == 0");
          }
        }
        else {
          CodeWriter::emitZeros(&writer,uVar7 & 0xffffffff);
        }
        CodeWriter::done(&writer,&this->super_BaseAssembler);
        pLVar1 = (this->super_BaseAssembler).super_BaseEmitter._logger;
        if (pLVar1 != (Logger *)0x0) {
          local_c0 = local_b8;
          uStack_d0 = 0;
          local_d8 = 0x20;
          local_c8 = 0x87;
          local_b8[0] = 0;
          local_dc = kCode;
          pbVar3 = Support::Array<unsigned_char,_4UL>::
                   operator[]<asmjit::v1_14::FormatIndentationGroup>
                             (&(pLVar1->_options)._indentation,&local_dc);
          String::_opChars((String *)&local_d8,kAppend,' ',(ulong)*pbVar3);
          String::_opFormat((String *)&local_d8,kAppend,"align %u\n",(ulong)alignment);
          pLVar1 = (this->super_BaseAssembler).super_BaseEmitter._logger;
          uVar7 = uStack_d0;
          puVar6 = local_c0;
          if ((local_d8 & 0xff) < 0x1f) {
            uVar7 = local_d8 & 0xff;
            puVar6 = (undefined1 *)((long)&local_d8 + 1);
          }
          (*pLVar1->_vptr_Logger[2])(pLVar1,puVar6,uVar7);
          String::reset((String *)&local_d8);
          return 0;
        }
        return 0;
      }
    }
    EStack_f0 = 2;
  }
  EVar2 = BaseEmitter::reportError((BaseEmitter *)this,EStack_f0,(char *)0x0);
  return EVar2;
}

Assistant:

Error Assembler::align(AlignMode alignMode, uint32_t alignment) {
  constexpr uint32_t kNopA64 = 0xD503201Fu; // [11010101|00000011|00100000|00011111].

  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (ASMJIT_UNLIKELY(uint32_t(alignMode) > uint32_t(AlignMode::kMaxValue)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (ASMJIT_UNLIKELY(alignment > Globals::kMaxAlignment || !Support::isPowerOf2(alignment)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = uint32_t(Support::alignUpDiff<size_t>(offset(), alignment));
  if (i == 0)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, i));

  switch (alignMode) {
    case AlignMode::kCode: {
      uint32_t pattern = kNopA64;

      if (ASMJIT_UNLIKELY(offset() & 0x3u))
        return DebugUtils::errored(kErrorInvalidState);

      while (i >= 4) {
        writer.emit32uLE(pattern);
        i -= 4;
      }

      ASMJIT_ASSERT(i == 0);
      break;
    }

    case AlignMode::kData:
    case AlignMode::kZero:
      writer.emitZeros(i);
      break;
  }

  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<128> sb;
    sb.appendChars(' ', _logger->indentation(FormatIndentationGroup::kCode));
    sb.appendFormat("align %u\n", alignment);
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}